

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

bool __thiscall Clasp::OutputTable::add(OutputTable *this,NameType *n,Literal c,uint32 u)

{
  bool bVar1;
  RefCount *p_1;
  PredType p;
  PredType local_38;
  
  bVar1 = filter(this,n);
  if (!bVar1) {
    local_38.name = (NameType)n->ref_;
    if ((int *)local_38.name.ref_ != (int *)0x0) {
      LOCK();
      *(int *)local_38.name.ref_ = *(int *)local_38.name.ref_ + 1;
      UNLOCK();
    }
    local_38.cond.rep_ = c.rep_;
    local_38.user = u;
    bk_lib::pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
    ::push_back(&this->preds_,&local_38);
    StrRef::release(local_38.name.ref_);
  }
  return !bVar1;
}

Assistant:

bool OutputTable::add(const NameType& n, Literal c, uint32 u) {
	if (!filter(n)) {
		PredType p = {n, c, u};
		preds_.push_back(p);
		return true;
	}
	return false;
}